

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O2

int uv_sem_trywait(uv_sem_t *sem)

{
  int iVar1;
  int *piVar2;
  
  do {
    iVar1 = sem_trywait((sem_t *)sem);
    if (iVar1 != -1) {
      if (iVar1 == 0) {
        return 0;
      }
      piVar2 = __errno_location();
      iVar1 = *piVar2;
      break;
    }
    piVar2 = __errno_location();
    iVar1 = *piVar2;
  } while (iVar1 == 4);
  if (iVar1 == 0xb) {
    return -0xb;
  }
  abort();
}

Assistant:

int uv_sem_trywait(uv_sem_t* sem) {
  int r;

  do
    r = sem_trywait(sem);
  while (r == -1 && errno == EINTR);

  if (r) {
    if (errno == EAGAIN)
      return -EAGAIN;
    abort();
  }

  return 0;
}